

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t iconv_strncat_in_locale(archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  archive_string *paVar1;
  size_t s;
  int *piVar2;
  long in_RCX;
  ulong in_RDX;
  char *in_RSI;
  long *in_RDI;
  size_t rbytes;
  size_t result;
  wchar_t from_size;
  wchar_t to_size;
  wchar_t return_value;
  size_t bs;
  size_t avail;
  char *outp;
  iconv_t cd;
  size_t remaining;
  char *itp;
  ulong local_78;
  size_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int iVar3;
  int local_60;
  wchar_t local_5c;
  ulong local_50;
  char *local_48;
  iconv_t local_40;
  ulong local_38;
  char *local_30;
  long local_28;
  ulong local_20;
  char *local_18;
  long *local_10;
  wchar_t local_4;
  
  local_5c = L'\0';
  if ((*(uint *)(in_RCX + 0x24) & 0x1400) == 0) {
    local_60 = 1;
  }
  else {
    local_60 = 2;
  }
  if ((*(uint *)(in_RCX + 0x24) & 0x2800) == 0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 2;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  paVar1 = archive_string_ensure
                     ((archive_string *)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
  if (paVar1 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_40 = *(iconv_t *)(local_28 + 0x28);
    local_30 = local_18;
    local_38 = local_20;
    local_48 = (char *)(*local_10 + local_10[1]);
    local_50 = (local_10[2] - local_10[1]) - (long)local_60;
    while (((ulong)(long)iVar3 <= local_38 &&
           (s = iconv(local_40,&local_30,&local_38,&local_48,&local_50), s == 0xffffffffffffffff)))
    {
      piVar2 = __errno_location();
      if ((*piVar2 == 0x54) || (piVar2 = __errno_location(), *piVar2 == 0x16)) {
        if ((*(uint *)(local_28 + 0x24) & 0x1500) == 0) {
          *local_48 = '?';
          local_50 = local_50 - 1;
          local_48 = local_48 + 1;
        }
        else {
          if ((*(uint *)(local_28 + 0x24) & 0x100) == 0) {
            local_78 = 2;
          }
          else {
            local_78 = 3;
          }
          if (local_50 < local_78) {
            local_10[1] = (long)local_48 - *local_10;
            paVar1 = archive_string_ensure
                               ((archive_string *)CONCAT44(iVar3,in_stack_ffffffffffffff98),s);
            if (paVar1 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            local_48 = (char *)(*local_10 + local_10[1]);
            local_50 = (local_10[2] - local_10[1]) - (long)local_60;
          }
          if ((*(uint *)(local_28 + 0x24) & 0x100) == 0) {
            if ((*(uint *)(local_28 + 0x24) & 0x400) == 0) {
              archive_le16enc(local_48,0xfffd);
            }
            else {
              archive_be16enc(local_48,0xfffd);
            }
          }
          else {
            *local_48 = -0x11;
            local_48[1] = -0x41;
            local_48[2] = -0x43;
          }
          local_50 = local_50 - local_78;
          local_48 = local_48 + local_78;
        }
        local_30 = local_30 + iVar3;
        local_38 = local_38 - (long)iVar3;
        local_5c = L'\xffffffff';
      }
      else {
        local_10[1] = (long)local_48 - *local_10;
        paVar1 = archive_string_ensure
                           ((archive_string *)CONCAT44(iVar3,in_stack_ffffffffffffff98),s);
        if (paVar1 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_48 = (char *)(*local_10 + local_10[1]);
        local_50 = (local_10[2] - local_10[1]) - (long)local_60;
      }
    }
    local_10[1] = (long)local_48 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    if (local_60 == 2) {
      *(undefined1 *)(*local_10 + 1 + local_10[1]) = 0;
    }
    local_4 = local_5c;
  }
  return local_4;
}

Assistant:

static int
iconv_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	ICONV_CONST char *itp;
	size_t remaining;
	iconv_t cd;
	char *outp;
	size_t avail, bs;
	int return_value = 0; /* success */
	int to_size, from_size;

	if (sc->flag & SCONV_TO_UTF16)
		to_size = 2;
	else
		to_size = 1;
	if (sc->flag & SCONV_FROM_UTF16)
		from_size = 2;
	else
		from_size = 1;

	if (archive_string_ensure(as, as->length + length*2+to_size) == NULL)
		return (-1);

	cd = sc->cd;
	itp = (char *)(uintptr_t)_p;
	remaining = length;
	outp = as->s + as->length;
	avail = as->buffer_length - as->length - to_size;
	while (remaining >= (size_t)from_size) {
		size_t result = iconv(cd, &itp, &remaining, &outp, &avail);

		if (result != (size_t)-1)
			break; /* Conversion completed. */

		if (errno == EILSEQ || errno == EINVAL) {
			/*
		 	 * If an output charset is UTF-8 or UTF-16BE/LE,
			 * unknown character should be U+FFFD
			 * (replacement character).
			 */
			if (sc->flag & (SCONV_TO_UTF8 | SCONV_TO_UTF16)) {
				size_t rbytes;
				if (sc->flag & SCONV_TO_UTF8)
					rbytes = UTF8_R_CHAR_SIZE;
				else
					rbytes = 2;

				if (avail < rbytes) {
					as->length = outp - as->s;
					bs = as->buffer_length +
					    (remaining * to_size) + rbytes;
					if (NULL ==
					    archive_string_ensure(as, bs))
						return (-1);
					outp = as->s + as->length;
					avail = as->buffer_length
					    - as->length - to_size;
				}
				if (sc->flag & SCONV_TO_UTF8)
					UTF8_SET_R_CHAR(outp);
				else if (sc->flag & SCONV_TO_UTF16BE)
					archive_be16enc(outp, UNICODE_R_CHAR);
				else
					archive_le16enc(outp, UNICODE_R_CHAR);
				outp += rbytes;
				avail -= rbytes;
			} else {
				/* Skip the illegal input bytes. */
				*outp++ = '?';
				avail--;
			}
			itp += from_size;
			remaining -= from_size;
			return_value = -1; /* failure */
		} else {
			/* E2BIG no output buffer,
			 * Increase an output buffer.  */
			as->length = outp - as->s;
			bs = as->buffer_length + remaining * 2;
			if (NULL == archive_string_ensure(as, bs))
				return (-1);
			outp = as->s + as->length;
			avail = as->buffer_length - as->length - to_size;
		}
	}
	as->length = outp - as->s;
	as->s[as->length] = 0;
	if (to_size == 2)
		as->s[as->length+1] = 0;
	return (return_value);
}